

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O3

bool __thiscall fp::Algorithm::IsExplored(Algorithm *this,array<int,_2UL> cur_node)

{
  undefined1 extraout_AL;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  uVar1 = (ulong)cur_node._M_elems[0];
  uVar3 = uVar1;
  if ((uVar1 < 0x10) && (uVar3 = (long)cur_node._M_elems >> 0x20, uVar3 < 0x10)) {
    return (this->explored_node_)._M_elems[uVar1]._M_elems[uVar3];
  }
  pcVar4 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar3,0x10);
  uVar2 = (ulong)(int)uVar3;
  uVar1 = uVar2;
  if ((uVar2 < 0x10) && (uVar1 = (long)uVar3 >> 0x20, uVar1 < 0x10)) {
    return (bool)pcVar4[uVar1 + 0xc5d0 + uVar2 * 0x10];
  }
  pcVar4 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar1,0x10);
  pcVar4[2] = '\0';
  API::clearAllColor();
  API::setColor(0,0,'g');
  API::setColor(*(int *)(pcVar4 + 0xc6d4),0xf - *(int *)(pcVar4 + 0xc6d0),'w');
  API::setColor(*(int *)(pcVar4 + 0xc6dc),0xf - *(int *)(pcVar4 + 0xc6d8),'w');
  API::setColor(*(int *)(pcVar4 + 0xc6e4),0xf - *(int *)(pcVar4 + 0xc6e0),'w');
  API::setColor(*(int *)(pcVar4 + 0xc6ec),0xf - *(int *)(pcVar4 + 0xc6e8),'w');
  return (bool)extraout_AL;
}

Assistant:

bool fp::Algorithm::IsExplored(std::array<int, 2> cur_node) {
    return this->explored_node_.at(cur_node.at(0)).at(cur_node.at(1));
}